

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFloat16.c
# Opt level: O2

deUint32 roundToNearestEven(deUint32 val,deUint32 numBitsToDiscard)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  
  bVar1 = (byte)numBitsToDiscard;
  uVar2 = val >> (bVar1 & 0x1f);
  uVar3 = 1 << (bVar1 - 1 & 0x1f) & val;
  if (uVar3 != 0) {
    if (uVar3 == (~(-1 << (bVar1 & 0x1f)) & val)) {
      return uVar2 + (uVar2 & 1);
    }
    uVar2 = uVar2 + 1;
  }
  return uVar2;
}

Assistant:

static deUint32 roundToNearestEven (deUint32 val, const deUint32 numBitsToDiscard)
{
	const deUint32	lastBits	= val & ((1 << numBitsToDiscard) - 1);
	const deUint32	headBit		= val & (1 << (numBitsToDiscard - 1));

	DE_ASSERT(numBitsToDiscard > 0 && numBitsToDiscard < 32);	/* Make sure no overflow. */
	val >>= numBitsToDiscard;

	if (headBit == 0)
	{
		return val;
	}
	else if (headBit == lastBits)
	{
		if ((val & 0x1) == 0x1)
		{
			return val + 1;
		}
		else
		{
			return val;
		}
	}
	else
	{
		return val + 1;
	}
}